

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeTetra>::FillOrderScalarShapeFunctions
               (TPZVec<int> *connectorders,TPZVec<int> *scalarorder)

{
  long *in_RSI;
  TPZVec<int> *in_RDI;
  int internalorder;
  int ncon;
  int *in_stack_00000028;
  TPZVec<int> *in_stack_00000030;
  
  (**(code **)(*in_RSI + 0x20))(in_RSI,0xb);
  TPZVec<int>::operator[](in_RDI,4);
  TPZVec<int>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)connectorders,(int64_t)scalarorder)
  ;
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FillOrderScalarShapeFunctions(const TPZVec<int> &connectorders, TPZVec<int> &scalarorder)
{
    scalarorder.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    const int ncon = TSHAPE::NFacets;
    int internalorder = connectorders[ncon];
    scalarorder.Fill(internalorder+1);
#ifdef PZDEBUG
    for(int ic=0; ic<ncon-1; ic++)
    {
        if(connectorders[ic] > internalorder) DebugStop();
    }
#endif
    return;
}